

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_get_cardinality(void **param_1)

{
  roaring64_bitmap_t *r_00;
  roaring64_bitmap_t *b;
  int i;
  roaring64_bitmap_t *r_1;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000070;
  roaring64_bitmap_t *in_stack_00000080;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  unsigned_long in_stack_ffffffffffffffe8;
  
  r_00 = roaring64_bitmap_create();
  roaring64_bitmap_add(r_00,in_stack_ffffffffffffffe8);
  roaring64_bitmap_add(r_00,in_stack_ffffffffffffffe8);
  roaring64_bitmap_add(r_00,in_stack_ffffffffffffffe8);
  roaring64_bitmap_add(r_00,in_stack_ffffffffffffffe8);
  roaring64_bitmap_add(r_00,in_stack_ffffffffffffffe8);
  roaring64_bitmap_get_cardinality(in_stack_00000080);
  _assert_int_equal((unsigned_long)r_00,in_stack_ffffffffffffffe8,
                    (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffdc);
  roaring64_bitmap_free(in_stack_00000070);
  b = roaring64_bitmap_create();
  for (iVar1 = 0; iVar1 < 7; iVar1 = iVar1 + 1) {
    roaring64_bitmap_add(r_00,(uint64_t)b);
  }
  roaring64_bitmap_get_cardinality(in_stack_00000080);
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)b,
                    (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  roaring64_bitmap_free(in_stack_00000070);
  return;
}

Assistant:

DEFINE_TEST(test_get_cardinality) {
    {
        roaring64_bitmap_t* r = roaring64_bitmap_create();

        roaring64_bitmap_add(r, 0);
        roaring64_bitmap_add(r, 100000);
        roaring64_bitmap_add(r, 100001);
        roaring64_bitmap_add(r, 100002);
        roaring64_bitmap_add(r, 200000);

        assert_int_equal(roaring64_bitmap_get_cardinality(r), 5);

        roaring64_bitmap_free(r);
    }
    {
        // Max depth ART.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        for (int i = 0; i < 7; ++i) {
            roaring64_bitmap_add(r, 1ULL << (i * 8 + 8));
        }
        assert_int_equal(roaring64_bitmap_get_cardinality(r), 7);
        roaring64_bitmap_free(r);
    }
}